

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O3

bool Js::JavascriptLibrary::InitializeFunctionPrototype
               (DynamicObject *functionPrototype,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *this;
  JavascriptFunction *pJVar1;
  JavascriptString *pJVar2;
  RuntimeFunction *pRVar3;
  JavascriptMethod entryPoint;
  ScriptContext *pSVar4;
  
  DeferredTypeHandlerBase::Convert(typeHandler,functionPrototype,mode,7,0);
  this = (((functionPrototype->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
  pSVar4 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  (*(functionPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
    ._vptr_IRecyclerVisitedObject[0x1e])
            (functionPrototype,0x67,(this->super_JavascriptLibraryBase).functionConstructor.ptr,6,0,
             0,0);
  (*(functionPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
    ._vptr_IRecyclerVisitedObject[0x1e])(functionPrototype,0xd1,0x1000000000000,2,0,0,0);
  pJVar2 = GetEmptyString(this);
  (*(functionPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
    ._vptr_IRecyclerVisitedObject[0x1e])(functionPrototype,0x106,pJVar2,2,0,0,0);
  pRVar3 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptFunction::EntryInfo::Apply,2,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0x4e);
  (*(functionPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
    ._vptr_IRecyclerVisitedObject[0x1e])(functionPrototype,0x4e,pRVar3,6,0,0,0);
  Memory::Recycler::WBSetBit(&this->field_0x830);
  *(RuntimeFunction **)&this->field_0x830 = pRVar3;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->field_0x830);
  pRVar3 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptFunction::EntryInfo::Bind,1,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0x54);
  (*(functionPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
    ._vptr_IRecyclerVisitedObject[0x1e])(functionPrototype,0x54,pRVar3,6,0,0,0);
  pRVar3 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptFunction::EntryInfo::Call,1,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0x5a);
  (*(functionPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
    ._vptr_IRecyclerVisitedObject[0x1e])(functionPrototype,0x5a,pRVar3,6,0,0,0);
  Memory::Recycler::WBSetBit(&this->field_0x838);
  *(RuntimeFunction **)&this->field_0x838 = pRVar3;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->field_0x838);
  pRVar3 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptFunction::EntryInfo::ToString,0,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0x178);
  (*(functionPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
    ._vptr_IRecyclerVisitedObject[0x1e])(functionPrototype,0x178,pRVar3,6,0,0,0);
  entryPoint = FunctionInfo::GetOriginalEntryPoint
                         ((FunctionInfo *)JavascriptFunction::EntryInfo::SymbolHasInstance);
  pRVar3 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptFunction::EntryInfo::SymbolHasInstance,1,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0x2c2);
  (*(functionPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
    ._vptr_IRecyclerVisitedObject[0x1e])(functionPrototype,0x12,pRVar3,6,0,0,0);
  ScriptContext::SetBuiltInLibraryFunction(pSVar4,entryPoint,&pRVar3->super_JavascriptFunction);
  (*(functionPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
    ._vptr_IRecyclerVisitedObject[0x3b])(functionPrototype,0x12,0);
  (*(functionPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
    ._vptr_IRecyclerVisitedObject[0x3c])(functionPrototype,0x12,0);
  pJVar1 = (this->super_JavascriptLibraryBase).throwTypeErrorRestrictedPropertyAccessorFunction.ptr;
  DynamicObject::SetAccessors(functionPrototype,0x1cd,pJVar1,pJVar1,PropertyOperation_None);
  (*(functionPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
    ._vptr_IRecyclerVisitedObject[0x3d])(functionPrototype,0x1cd,0);
  pJVar1 = (this->super_JavascriptLibraryBase).throwTypeErrorRestrictedPropertyAccessorFunction.ptr;
  DynamicObject::SetAccessors(functionPrototype,0x1cf,pJVar1,pJVar1,PropertyOperation_None);
  pSVar4 = (ScriptContext *)0x1cf;
  (*(functionPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
    ._vptr_IRecyclerVisitedObject[0x3d])(functionPrototype,0x1cf,0);
  CheckRegisteredBuiltIns((Type *)&this->field_0x650,pSVar4);
  DynamicObject::SetHasNoEnumerableProperties(functionPrototype,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeFunctionPrototype(DynamicObject* functionPrototype, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(functionPrototype, mode, 7);
        // Note: Any new function addition/deletion/modification should also be updated in JavascriptLibrary::ProfilerRegisterFunction
        // so that the update is in sync with profiler
        ScriptContext* scriptContext = functionPrototype->GetScriptContext();
        JavascriptLibrary* library = functionPrototype->GetLibrary();
        Field(JavascriptFunction*)* builtinFuncs = library->GetBuiltinFunctions();

        library->AddMember(functionPrototype, PropertyIds::constructor, library->functionConstructor);
        library->AddMember(functionPrototype, PropertyIds::length, TaggedInt::ToVarUnchecked(0), PropertyConfigurable);
        library->AddMember(functionPrototype, PropertyIds::name, library->GetEmptyString(), PropertyConfigurable);

        JavascriptFunction *func = library->AddFunctionToLibraryObject(functionPrototype, PropertyIds::apply, &JavascriptFunction::EntryInfo::Apply, 2);
        builtinFuncs[BuiltinFunction::JavascriptFunction_Apply] = func;

        library->AddFunctionToLibraryObject(functionPrototype, PropertyIds::bind, &JavascriptFunction::EntryInfo::Bind, 1);
        func = library->AddFunctionToLibraryObject(functionPrototype, PropertyIds::call, &JavascriptFunction::EntryInfo::Call, 1);
        builtinFuncs[BuiltinFunction::JavascriptFunction_Call] = func;
        library->AddFunctionToLibraryObject(functionPrototype, PropertyIds::toString, &JavascriptFunction::EntryInfo::ToString, 0);

        scriptContext->SetBuiltInLibraryFunction(JavascriptFunction::EntryInfo::SymbolHasInstance.GetOriginalEntryPoint(),
                                                    library->AddFunctionToLibraryObjectWithName(functionPrototype, PropertyIds::_symbolHasInstance, PropertyIds::_RuntimeFunctionNameId_hasInstance,
                                                                                                &JavascriptFunction::EntryInfo::SymbolHasInstance, 1));
        functionPrototype->SetWritable(PropertyIds::_symbolHasInstance, false);
        functionPrototype->SetConfigurable(PropertyIds::_symbolHasInstance, false);

        functionPrototype->DynamicObject::SetAccessors(PropertyIds::caller, library->throwTypeErrorRestrictedPropertyAccessorFunction, library->throwTypeErrorRestrictedPropertyAccessorFunction);
        functionPrototype->SetEnumerable(PropertyIds::caller, false);
        functionPrototype->DynamicObject::SetAccessors(PropertyIds::arguments, library->throwTypeErrorRestrictedPropertyAccessorFunction, library->throwTypeErrorRestrictedPropertyAccessorFunction);
        functionPrototype->SetEnumerable(PropertyIds::arguments, false);

        DebugOnly(CheckRegisteredBuiltIns(builtinFuncs, scriptContext));

        functionPrototype->SetHasNoEnumerableProperties(true);

        return true;
    }